

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

void stlez_(double *y,int *n,int *np,int *ns,int *isdeg,int *itdeg,int *robust,int *no,double *rw,
           double *season,double *trend,double *work)

{
  long lVar1;
  long lVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int local_64 [2];
  int c_false;
  int c_true;
  int ni;
  int local_50;
  uint local_4c;
  int ildeg;
  int newnp;
  int local_40;
  int nljump;
  int nsjump;
  int ntjump;
  
  local_64[0] = 0;
  local_64[1] = 1;
  uVar9 = *np * 2 + *n;
  local_50 = *itdeg;
  uVar4 = imax(3,*ns);
  ildeg = uVar4 | 1;
  uVar5 = imax(2,*np);
  _nsjump = (double)(int)(uVar4 | 1);
  local_4c = uVar5;
  uVar4 = imax(3,(int)(((double)(int)uVar5 * 1.5) / (1.0 - 1.5 / _nsjump) + 0.5));
  c_false = (*robust == 0) + 1;
  c_true = uVar5 | 1;
  ni = uVar4 | 1;
  local_40 = imax(1,(int)(_nsjump / 10.0 + 0.9));
  nljump = imax(1,(int)((double)(int)(uVar4 | 1) / 10.0 + 0.9));
  newnp = imax(1,(int)((double)(int)(uVar5 | 1) / 10.0 + 0.9));
  if (0 < (long)*n) {
    memset(trend,0,(long)*n << 3);
  }
  stlstp_(y,n,(int *)&local_4c,&ildeg,&ni,&c_true,isdeg,itdeg,&local_50,&local_40,&nljump,&newnp,
          &c_false,local_64,rw,season,trend,work);
  *no = 0;
  if (*robust == 0) {
    uVar4 = *n;
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        rw[uVar8] = 1.0;
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  else {
    lVar6 = (long)(int)~uVar9;
    uVar8 = (ulong)(uint)*n;
    lVar1 = (long)(int)(uVar9 * 7) * 8 + lVar6 * 8;
    lVar2 = (long)(int)(uVar9 * 6) * 8 + lVar6 * 8;
    nsjump = 1;
    while( true ) {
      if (0 < (int)uVar8) {
        lVar7 = 0;
        do {
          *(undefined8 *)((long)work + lVar7 + lVar2 + 8) = *(undefined8 *)((long)season + lVar7);
          dVar16 = *(double *)((long)trend + lVar7);
          *(double *)((long)work + lVar7 + lVar1 + 8) = dVar16;
          *(double *)((long)work + lVar7 + (long)(int)uVar9 * 8 + lVar6 * 8 + 8) =
               dVar16 + *(double *)((long)season + lVar7);
          lVar7 = lVar7 + 8;
        } while (uVar8 << 3 != lVar7);
      }
      stlrwt_(y,n,work,rw);
      stlstp_(y,n,(int *)&local_4c,&ildeg,&ni,&c_true,isdeg,itdeg,&local_50,&local_40,&nljump,&newnp
              ,&c_false,local_64 + 1,rw,season,trend,work);
      *no = *no + 1;
      dVar16 = work[lVar6 + (int)(uVar9 * 6 + 1)];
      dVar13 = work[lVar6 + (long)(int)(uVar9 * 7) + 1];
      dVar10 = ABS(dVar16 - *season);
      dVar11 = ABS(dVar13 - *trend);
      uVar8 = (ulong)(uint)*n;
      dVar15 = dVar13;
      dVar18 = dVar16;
      if (1 < *n) {
        lVar7 = 0;
        dVar12 = dVar13;
        dVar17 = dVar16;
        dVar14 = dVar13;
        dVar19 = dVar16;
        do {
          dVar3 = *(double *)((long)work + lVar7 + lVar2 + 0x10);
          dVar16 = dVar3;
          if (dVar3 <= dVar17) {
            dVar16 = dVar17;
          }
          dVar17 = *(double *)((long)work + lVar7 + lVar1 + 0x10);
          dVar13 = dVar17;
          if (dVar17 <= dVar12) {
            dVar13 = dVar12;
          }
          dVar18 = dVar3;
          if (dVar19 <= dVar3) {
            dVar18 = dVar19;
          }
          dVar15 = dVar17;
          if (dVar14 <= dVar17) {
            dVar15 = dVar14;
          }
          dVar14 = ABS(dVar3 - *(double *)((long)season + lVar7 + 8));
          dVar12 = ABS(dVar17 - *(double *)((long)trend + lVar7 + 8));
          if (dVar14 <= dVar10) {
            dVar14 = dVar10;
          }
          dVar10 = dVar14;
          if (dVar12 <= dVar11) {
            dVar12 = dVar11;
          }
          dVar11 = dVar12;
          lVar7 = lVar7 + 8;
          dVar12 = dVar13;
          dVar17 = dVar16;
          dVar14 = dVar15;
          dVar19 = dVar18;
        } while (uVar8 * 8 + -8 != lVar7);
      }
      if (((dVar10 / (dVar16 - dVar18) < 0.01) && (dVar11 / (dVar13 - dVar15) < 0.01)) ||
         (0xe < (uint)nsjump)) break;
      nsjump = nsjump + 1;
    }
  }
  return;
}

Assistant:

void stlez_(double *y, int *n, int *np, int *ns, int *isdeg, int *itdeg,int *robust, int *no, 
	double *rw, double *season, double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;
    double d__1;

    /* Local variables */
    int i__, j, ni, nl, nt;
    double difs, dift, mins, mint, maxs, maxt;
    int ildeg;
    double maxds, maxdt;
    int newnp, newns, nljump, nsjump, ntjump;
	int c_false = 0;
	int c_true = 1;

		// Robust

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    ildeg = *itdeg;
    newns = imax(3,*ns);
    if (newns % 2 == 0) {
	++newns;
    }
    newnp = imax(2,*np);
    nt = newnp * 1.5 / (1 - 1.5 / newns) + .5;
    nt = imax(3,nt);
    if (nt % 2 == 0) {
	++nt;
    }
    nl = newnp;
    if (nl % 2 == 0) {
	++nl;
    }
    if (*robust) {
	ni = 1;
    } else {
	ni = 2;
    }
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) newns / 10 + .9);
    nsjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nt / 10 + .9);
    ntjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nl / 10 + .9);
    nljump = imax(i__1,i__2);
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L2: */
    }
    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, &nsjump,
	     &ntjump, &nljump, &ni, &c_false, &rw[1], &season[1], &trend[1], &
	    work[work_offset]);
    *no = 0;
    if (*robust) {
	j = 1;
/*        Loop  --- 15 robustness iterations */
L100:
	if (j <= 15) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		work[i__ + work_dim1 * 6] = season[i__];
		work[i__ + work_dim1 * 7] = trend[i__];
		work[i__ + work_dim1] = trend[i__] + season[i__];
/* L35: */
	    }
	    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
	    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, 
		    &nsjump, &ntjump, &nljump, &ni, &c_true, &rw[1], &season[
		    1], &trend[1], &work[work_offset]);
	    ++(*no);
	    maxs = work[work_dim1 * 6 + 1];
	    mins = work[work_dim1 * 6 + 1];
	    maxt = work[work_dim1 * 7 + 1];
	    mint = work[work_dim1 * 7 + 1];
	    maxds = (d__1 = work[work_dim1 * 6 + 1] - season[1], fabs(d__1));
	    maxdt = (d__1 = work[work_dim1 * 7 + 1] - trend[1], fabs(d__1));
	    i__1 = *n;
	    for (i__ = 2; i__ <= i__1; ++i__) {
		if (maxs < work[i__ + work_dim1 * 6]) {
		    maxs = work[i__ + work_dim1 * 6];
		}
		if (maxt < work[i__ + work_dim1 * 7]) {
		    maxt = work[i__ + work_dim1 * 7];
		}
		if (mins > work[i__ + work_dim1 * 6]) {
		    mins = work[i__ + work_dim1 * 6];
		}
		if (mint > work[i__ + work_dim1 * 7]) {
		    mint = work[i__ + work_dim1 * 7];
		}
		difs = (d__1 = work[i__ + work_dim1 * 6] - season[i__], fabs(
			d__1));
		dift = (d__1 = work[i__ + work_dim1 * 7] - trend[i__], fabs(
			d__1));
		if (maxds < difs) {
		    maxds = difs;
		}
		if (maxdt < dift) {
		    maxdt = dift;
		}
/* L137: */
	    }
	    if (maxds / (maxs - mins) < .01 && maxdt / (maxt - mint) < .01) 
		    {
		goto L300;
	    }
/* L151: */
	    ++j;
	    goto L100;
	}
/*        end Loop */
L300:
	;
    } else {
/*     	.not. robust */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L150: */
	}
    }
}